

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualStack.cpp
# Opt level: O3

Variable * __thiscall VirtualStack::pop(Variable *__return_storage_ptr__,VirtualStack *this)

{
  pointer pcVar1;
  Variable *pVVar2;
  undefined3 uVar3;
  uint uVar4;
  string *psVar5;
  
  if (this->stackOffset != 0) {
    uVar4 = this->stackOffset - 1;
    this->stackOffset = uVar4;
    __return_storage_ptr__->type = this->stack[uVar4].type;
    (__return_storage_ptr__->identifier)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->identifier).field_2;
    pcVar1 = this->stack[uVar4].identifier._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->identifier,pcVar1,
               pcVar1 + this->stack[uVar4].identifier._M_string_length);
    pVVar2 = this->stack + uVar4;
    uVar3 = *(undefined3 *)&pVVar2->field_0x29;
    uVar4 = pVVar2->arrayLength;
    __return_storage_ptr__->isArray = pVVar2->isArray;
    *(undefined3 *)&__return_storage_ptr__->field_0x29 = uVar3;
    __return_storage_ptr__->arrayLength = uVar4;
    return __return_storage_ptr__;
  }
  psVar5 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar5 = psVar5 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar5,"Can\'t pop from virtual stack, stack empty","");
  __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

Variable VirtualStack::pop()
{
   // std::cout << "\nPop type: " << dataTypeToString(stack[stackOffset-1].type) << ". Stack size: " << stackOffset-1;
    if(stackOffset == 0)
        throw std::string("Can't pop from virtual stack, stack empty");
    return stack[--stackOffset];
}